

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_pushcclosure(lua_State *L,lua_CFunction fn,int n)

{
  StkId pTVar1;
  CClosure *pCVar2;
  int iVar3;
  CClosure *x_;
  TValue *io_1;
  TValue *io1;
  CClosure *cl;
  TValue *io;
  int n_local;
  lua_CFunction fn_local;
  lua_State *L_local;
  
  if (n == 0) {
    pTVar1 = L->top;
    (pTVar1->value_).f = fn;
    pTVar1->tt_ = 0x16;
    L->top = L->top + 1;
  }
  else {
    pCVar2 = luaF_newCclosure(L,n);
    pCVar2->f = fn;
    L->top = L->top + -(long)n;
    io._4_4_ = n;
    while (iVar3 = io._4_4_ + -1, io._4_4_ != 0) {
      pTVar1 = L->top;
      pCVar2->upvalue[iVar3].value_ = pTVar1[iVar3].value_;
      (&pCVar2->upvalue[iVar3].value_)[1] = *(Value *)&pTVar1[iVar3].tt_;
      io._4_4_ = iVar3;
    }
    pTVar1 = L->top;
    (pTVar1->value_).gc = (GCObject *)pCVar2;
    pTVar1->tt_ = 0x66;
    L->top = L->top + 1;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
  }
  return;
}

Assistant:

LUA_API void lua_pushcclosure (lua_State *L, lua_CFunction fn, int n) {
  lua_lock(L);
  if (n == 0) {
    setfvalue(L->top, fn);
    api_incr_top(L);
  }
  else {
    CClosure *cl;
    api_checknelems(L, n);
    api_check(L, n <= MAXUPVAL, "upvalue index too large");
    cl = luaF_newCclosure(L, n);
    cl->f = fn;
    L->top -= n;
    while (n--) {
      setobj2n(L, &cl->upvalue[n], L->top + n);
      /* does not need barrier because closure is white */
    }
    setclCvalue(L, L->top, cl);
    api_incr_top(L);
    luaC_checkGC(L);
  }
  lua_unlock(L);
}